

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O0

int helics::readSize(string_view val)

{
  string_view V;
  size_type sVar1;
  size_type sVar2;
  const_iterator pvVar3;
  const_iterator pvVar4;
  difference_type dVar5;
  basic_string_view<char,_std::char_traits<char>_> bVar6;
  difference_type res;
  invalid_argument *anon_var_0;
  int size;
  size_type firstBracket;
  char in_stack_ffffffffffffff7f;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  size_type in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffa0;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  int local_4;
  
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                    (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f,0x32b304);
  if (sVar1 < 2) {
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_not_of
                      (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90
                      );
    if (sVar2 == 0xffffffffffffffff) {
      local_4 = 0;
    }
    else {
      pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::begin(&local_18);
      pvVar3 = pvVar3 + sVar1;
      pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::end(&local_18);
      dVar5 = std::
              count_if<char_const*,helics::readSize(std::basic_string_view<char,std::char_traits<char>>)::__0>
                        (pvVar3,pvVar4);
      local_4 = (int)dVar5 + 1;
    }
  }
  else {
    bVar6 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (in_stack_ffffffffffffffa0,(size_type)in_stack_ffffffffffffff98,
                       in_stack_ffffffffffffff90);
    V._M_len._4_4_ = in_stack_ffffffffffffff8c;
    V._M_len._0_4_ = in_stack_ffffffffffffff88;
    V._M_str = bVar6._M_str;
    local_4 = gmlc::utilities::numConv<int>(V);
  }
  return local_4;
}

Assistant:

static int readSize(std::string_view val)
{
    auto firstBracket = val.find_first_of('[');
    if (firstBracket > 1) {
        try {
            auto size = numConv<int>(val.substr(1, firstBracket - 1));
            return size;
        }
        // NOLINTNEXTLINE
        catch (const std::invalid_argument&) {
            // go to the alternative path if this fails
        }
    }
    if (val.find_first_not_of(" ]", firstBracket + 1) == std::string_view::npos) {
        return 0;
    }
    auto res = std::count_if(val.begin() + firstBracket,
                             val.end(),
                             [](auto nextChar) { return (nextChar == ',') || (nextChar == ';'); }) +
        1;
    return static_cast<int>(res);
}